

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemory(BinaryReader *this,Limits *out_page_limits)

{
  uint uVar1;
  Result RVar2;
  char *format;
  uint8_t flags;
  uint32_t max;
  uint32_t initial;
  
  max = 0;
  RVar2 = ReadU8(this,&flags,"memory flags");
  if (RVar2.enum_ != Error) {
    if (flags < 8) {
      if (((flags & 2) == 0) || ((this->options_->features).threads_enabled_ != false)) {
        if (((flags & 4) == 0) || ((this->options_->features).memory64_enabled_ != false)) {
          RVar2 = ReadU32Leb128(this,&initial,"memory initial page count");
          if (RVar2.enum_ == Error) {
            return (Result)Error;
          }
          uVar1 = 0;
          if (((flags & 1) != 0) &&
             (RVar2 = ReadU32Leb128(this,&max,"memory max page count"), uVar1 = max,
             RVar2.enum_ == Error)) {
            return (Result)Error;
          }
          out_page_limits->has_max = (bool)(flags & 1);
          out_page_limits->is_shared = SUB41((flags & 2) >> 1,0);
          out_page_limits->is_64 = SUB41((flags & 4) >> 2,0);
          out_page_limits->initial = (ulong)initial;
          out_page_limits->max = (ulong)uVar1;
          std::vector<wabt::Limits,_std::allocator<wabt::Limits>_>::push_back
                    (&this->memories,out_page_limits);
          return (Result)Ok;
        }
        format = "memory64 not allowed";
      }
      else {
        format = "memory may not be shared: threads not allowed";
      }
      PrintError(this,format);
    }
    else {
      PrintError(this,"malformed memory limits flag: %d",(ulong)(uint)flags);
    }
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits) {
  uint8_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "memory flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_FLAGS;
  ERROR_UNLESS(unknown_flags == 0, "malformed memory limits flag: %d", flags);
  ERROR_IF(is_shared && !options_.features.threads_enabled(),
           "memory may not be shared: threads not allowed");
  ERROR_IF(is_64 && !options_.features.memory64_enabled(),
           "memory64 not allowed");
  CHECK_RESULT(ReadU32Leb128(&initial, "memory initial page count"));
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "memory max page count"));
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->is_64 = is_64;
  out_page_limits->initial = initial;
  out_page_limits->max = max;

  // Have to keep a copy of these, to know how to interpret load/stores.
  memories.push_back(*out_page_limits);
  return Result::Ok;
}